

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  pointer puVar6;
  allocator<char> local_119;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  elfio reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[1],(allocator<char> *)&reader);
    ELFIO::elfio::elfio(&reader);
    bVar2 = ELFIO::elfio::load(&reader,&filename,false);
    if (bVar2) {
      puVar1 = ((reader.sections.parent)->sections_).
               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = ((reader.sections.parent)->sections_).
                    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1
          ) {
        iVar4 = (*((puVar6->_M_t).
                   super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                   super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                   super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[5])()
        ;
        if (iVar4 == 3) {
          (*((puVar6->_M_t).
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
             super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section[3])
                    (&local_f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,".strtab",&local_119);
          _Var3 = std::operator==(&local_f8,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_f8);
          if (_Var3) {
            process_string_table
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                       .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl,&filename);
          }
        }
      }
      iVar4 = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar5 = std::operator<<(poVar5,(string *)&filename);
      std::operator<<(poVar5," is not found or it is not an ELF file\n");
      iVar4 = 1;
    }
    ELFIO::elfio::~elfio(&reader);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Usage: anonymizer <file_name>\n");
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: anonymizer <file_name>\n";
        return 1;
    }

    std::string filename = argv[1];

    elfio reader;

    if ( !reader.load( filename ) ) {
        std::cerr << "File " << filename
                  << " is not found or it is not an ELF file\n";
        return 1;
    }

    for ( const auto& section : reader.sections ) {
        if ( section->get_type() == SHT_STRTAB &&
             std::string( section->get_name() ) == std::string( ".strtab" ) ) {
            process_string_table( section.get(), filename );
        }
    }
    return 0;
}